

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Accumulator.hpp
# Opt level: O2

Vector<double,_3U> * __thiscall
OpenMD::Utils::Accumulator<OpenMD::Vector<double,_3U>_>::get95percentConfidenceInterval
          (Vector<double,_3U> *__return_storage_ptr__,Accumulator<OpenMD::Vector<double,_3U>_> *this
          )

{
  size_t sVar1;
  size_t i;
  long lVar2;
  Vector<double,_3U> stdDev;
  Vector<double,_3U> local_28;
  
  Vector<double,_3U>::Vector(__return_storage_ptr__);
  getStdDev(&local_28,this);
  sVar1 = this->Count_;
  for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
    __return_storage_ptr__->data_[lVar2] =
         (local_28.data_[lVar2] * 1.96) /
         SQRT(((double)CONCAT44(0x45300000,(int)(sVar1 >> 0x20)) - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0));
  }
  return __return_storage_ptr__;
}

Assistant:

Vector<RealType, Dim> get95percentConfidenceInterval() const {
      assert(Count_ != 0);

      Vector<RealType, Dim> ci {};
      Vector<RealType, Dim> stdDev = this->getStdDev();

      for (std::size_t i = 0; i < Dim; i++) {
        ci[i] = 1.960 * stdDev[i] / std::sqrt(static_cast<RealType>(Count_));
      }

      return ci;
    }